

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int mg_send_http_error(mg_connection *conn,int status,char *fmt,...)

{
  char cVar1;
  _func_int_mg_connection_ptr_int_char_ptr *p_Var2;
  bool bVar3;
  mg_connection *conn_00;
  char in_AL;
  int iVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  ptrdiff_t pVar8;
  int *piVar9;
  uint uVar10;
  undefined8 in_RCX;
  mg_file *filep;
  mg_file_stat *extraout_RDX;
  mg_file_stat *filep_00;
  mg_file_stat *extraout_RDX_00;
  time_t *t;
  undefined8 in_R8;
  char *pcVar11;
  undefined8 in_R9;
  ulong uVar12;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int truncated;
  char *local_31c0;
  int local_31b8;
  uint local_31b4;
  char *local_31b0;
  mg_connection *local_31a8;
  time_t local_31a0;
  va_list ap;
  mg_file local_3178;
  va_list ap_1;
  char date [64];
  undefined1 local_30e8 [24];
  undefined8 local_30d0;
  undefined8 local_30c8;
  undefined8 local_30c0;
  undefined4 local_30b8;
  undefined8 local_30a8;
  undefined8 local_3098;
  undefined8 local_3088;
  undefined8 local_3078;
  undefined8 local_3068;
  undefined8 local_3058;
  undefined8 local_3048;
  char cStack_3039;
  char path_buf [4096];
  char errmsg_buf [8192];
  
  ap[0].reg_save_area = local_30e8;
  if (in_AL != '\0') {
    local_30b8 = in_XMM0_Da;
    local_30a8 = in_XMM1_Qa;
    local_3098 = in_XMM2_Qa;
    local_3088 = in_XMM3_Qa;
    local_3078 = in_XMM4_Qa;
    local_3068 = in_XMM5_Qa;
    local_3058 = in_XMM6_Qa;
    local_3048 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].gp_offset = 0x18;
  ap[0].fp_offset = 0x30;
  local_3178.stat.is_directory = 0;
  local_3178.stat.is_gzipped = 0;
  local_3178.stat.location = 0;
  local_3178.stat._28_4_ = 0;
  local_3178.stat.size = 0;
  local_3178.stat.last_modified = 0;
  local_3178.access.fp = (FILE *)0x0;
  if (fmt == (char *)0x0 || conn == (mg_connection *)0x0) {
    return -2;
  }
  conn->status_code = status;
  local_30d0 = in_RCX;
  local_30c8 = in_R8;
  local_30c0 = in_R9;
  if (((status < 200) || (status == 0x130)) || (status == 0xcc)) {
    if (conn->in_error_handler != 0) goto LAB_00119365;
    if ((conn->phys_ctx->callbacks).http_error != (_func_int_mg_connection_ptr_int_char_ptr *)0x0)
    goto LAB_0011903f;
  }
  else {
LAB_0011903f:
    ap_1[0].gp_offset = 0x18;
    ap_1[0].fp_offset = 0x30;
    ap_1[0].overflow_arg_area = ap[0].overflow_arg_area;
    ap_1[0].reg_save_area = ap[0].reg_save_area;
    mg_vsnprintf(conn,(int *)0x0,errmsg_buf,0x2000,fmt,ap_1);
    if (conn->in_error_handler != 0) goto LAB_00119365;
  }
  p_Var2 = (conn->phys_ctx->callbacks).http_error;
  if (p_Var2 == (_func_int_mg_connection_ptr_int_char_ptr *)0x0) {
    if (conn->in_error_handler != 0) goto LAB_00119365;
  }
  else {
    conn->in_error_handler = 1;
    iVar4 = (*p_Var2)(conn,status,errmsg_buf);
    conn->in_error_handler = 0;
    if (iVar4 == 0) {
      return 0;
    }
  }
  local_31c0 = conn->dom_ctx->config[0x37];
  if (local_31c0 != (char *)0x0) {
    local_31b0 = conn->dom_ctx->config[0x24];
    local_31b8 = status / 100;
    filep = (mg_file *)0x1;
    bVar3 = false;
    local_31a8 = conn;
    while ((conn_00 = local_31a8, uVar10 = (uint)filep, uVar10 < 4 && (!bVar3))) {
      if (uVar10 == 2) {
        pcVar11 = "%serror%01uxx.";
      }
      else if (uVar10 == 1) {
        pcVar11 = "%serror%03u.";
      }
      else {
        pcVar11 = "%serror.";
      }
      local_31b4 = uVar10;
      mg_snprintf(local_31a8,&truncated,path_buf,0xfe0,pcVar11,local_31c0);
      path_buf[0xfe0] = '\0';
      sVar6 = strlen(path_buf);
      iVar5 = (int)sVar6;
      iVar4 = 0xfe0;
      if (iVar5 < 0xfe0) {
        iVar4 = iVar5;
      }
      pcVar11 = strchr(local_31b0,0x2e);
      lVar7 = (long)iVar5;
      filep_00 = extraout_RDX;
      if (0xfdf < lVar7) {
        lVar7 = 0xfe0;
      }
      while (pcVar11 != (char *)0x0) {
        for (uVar12 = 1; uVar12 != 0x20; uVar12 = uVar12 + 1) {
          cVar1 = pcVar11[uVar12];
          if ((cVar1 == '\0') || (cVar1 == ',')) goto LAB_00119214;
          path_buf[uVar12 + lVar7 + -1] = cVar1;
        }
        uVar12 = 0x20;
LAB_00119214:
        path_buf[iVar4 + -1 + (int)uVar12] = '\0';
        iVar5 = mg_stat((mg_connection *)path_buf,(char *)&local_3178,filep_00);
        if (iVar5 != 0) {
          bVar3 = true;
          goto LAB_00119250;
        }
        pcVar11 = strchr(pcVar11 + (uVar12 & 0xffffffff),0x2e);
        filep_00 = extraout_RDX_00;
      }
      bVar3 = false;
LAB_00119250:
      filep = (mg_file *)(ulong)(local_31b4 + 1);
    }
    conn = local_31a8;
    if (bVar3) {
      local_31a8->in_error_handler = 1;
      if (local_31a8->dom_ctx != (mg_domain_context *)0x0) {
        pVar8 = match_prefix_strlen(local_31a8->dom_ctx->config[0x20],path_buf);
        if (pVar8 < 1) {
          handle_static_file_request(conn_00,path_buf,&local_3178,(char *)0x0,(char *)0x0);
        }
        else {
          local_31a0 = time((time_t *)0x0);
          iVar4 = mg_fopen((mg_connection *)path_buf,(char *)0x1,(int)&local_3178,filep);
          if (iVar4 == 0) {
            piVar9 = __errno_location();
            pcVar11 = strerror(*piVar9);
            mg_send_http_error(conn_00,500,"Error: Cannot read file\nfopen(%s): %s",path_buf,pcVar11
                              );
          }
          else {
            conn_00->must_close = 1;
            gmt_time_string(date,(size_t)&local_31a0,t);
            fclose_on_exec(&local_3178.access,conn_00);
            mg_response_header_start(conn_00,200);
            send_no_cache_header(conn_00);
            send_additional_header(conn_00);
            send_cors_header(conn_00);
            mg_response_header_add(conn_00,"Content-Type","text/html",-1);
            mg_response_header_send(conn_00);
            send_ssi_file(conn_00,path_buf,&local_3178,0);
            mg_fclose(&local_3178.access);
          }
        }
      }
      conn_00->in_error_handler = 0;
      return 0;
    }
  }
LAB_00119365:
  conn->must_close = 1;
  mg_response_header_start(conn,status);
  send_no_cache_header(conn);
  send_additional_header(conn);
  send_cors_header(conn);
  if (status < 200) {
    mg_response_header_send(conn);
    return 0;
  }
  if ((status != 0xcc) && (status != 0x130)) {
    mg_response_header_add(conn,"Content-Type","text/plain; charset=utf-8",-1);
  }
  mg_response_header_send(conn);
  if (status != 0xcc) {
    if (status != 0x130) {
      pcVar11 = mg_get_response_code_text(conn,status);
      mg_printf(conn,"Error %d: %s\n",(ulong)(uint)status,pcVar11);
      sVar6 = strlen(errmsg_buf);
      mg_write(conn,errmsg_buf,sVar6);
      return 0;
    }
    return 0;
  }
  return 0;
}

Assistant:

CIVETWEB_API int
mg_send_http_error(struct mg_connection *conn, int status, const char *fmt, ...)
{
	va_list ap;
	int ret;

	va_start(ap, fmt);
	ret = mg_send_http_error_impl(conn, status, fmt, ap);
	va_end(ap);

	return ret;
}